

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revsurface.hpp
# Opt level: O1

void __thiscall RevSurface::RevSurface(RevSurface *this,Json *json)

{
  bool bVar1;
  const_reference pvVar2;
  reference other;
  Curve *this_00;
  vec3f vVar3;
  vector<vec3f,_std::allocator<vec3f>_> controls;
  const_iterator __end1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  p;
  value_type curvetype;
  const_iterator __begin1;
  vector<vec3f,_std::allocator<vec3f>_> local_c8;
  vec3f local_a8;
  RevSurface *local_98;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_90;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  const_iterator local_50;
  
  (this->super_ParamSurface).super_Primitive._vptr_Primitive = (_func_int **)&PTR_intersect_0016bf08
  ;
  local_98 = this;
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)json,"curve");
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar2,"type");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_60,pvVar2);
  local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
  _M_finish = (vec3f *)0x0;
  local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (vec3f *)0x0;
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)json,"curve");
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar2,"controls");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::cbegin(&local_50,pvVar2);
  local_90.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_90.m_it.array_iterator._M_current = (pointer)0x0;
  local_90.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  if (pvVar2->m_type == array) {
    local_90.m_it.array_iterator._M_current =
         (((pvVar2->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else if (pvVar2->m_type == object) {
    local_90.m_it.object_iterator._M_node =
         &(((pvVar2->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_90.m_it.primitive_iterator.m_it = 1;
  }
  local_90.m_object = pvVar2;
  while (bVar1 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator==(&local_50,&local_90), !bVar1) {
    other = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator*(&local_50);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_70,other);
    vVar3 = json2vec3f((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_70);
    local_a8.z = vVar3.z;
    local_a8._0_8_ = vVar3._0_8_;
    if (local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<vec3f,_std::allocator<vec3f>_>::_M_realloc_insert<vec3f>
                (&local_c8,
                 (iterator)
                 local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_a8);
    }
    else {
      (local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_finish)->z = local_a8.z;
      (local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_finish)->x = local_a8.x;
      (local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_finish)->y = local_a8.y;
      local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_70 + 8),local_70[0]);
    if ((local_50.m_object)->m_type == array) {
      local_50.m_it.array_iterator._M_current = local_50.m_it.array_iterator._M_current + 1;
    }
    else if ((local_50.m_object)->m_type == object) {
      local_50.m_it.object_iterator._M_node =
           (_Base_ptr)std::_Rb_tree_increment(local_50.m_it.object_iterator._M_node);
    }
    else {
      local_50.m_it.primitive_iterator.m_it = local_50.m_it.primitive_iterator.m_it + 1;
    }
  }
  bVar1 = nlohmann::operator==<const_char_*,_0>((const_reference)local_60,"Bspline");
  if (bVar1) {
    this_00 = (Curve *)operator_new(0x20);
    BsplineCurve::BsplineCurve((BsplineCurve *)this_00,&local_c8);
    local_98->curve = this_00;
  }
  ParamSurface::buildmesh(&local_98->super_ParamSurface);
  if (local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_60 + 8),local_60[0]);
  return;
}

Assistant:

RevSurface(const Json& json)
	{
		auto curvetype = json["curve"]["type"];
		std::vector<vec3f> controls;
		for (auto p: json["curve"]["controls"])
			controls.push_back(json2vec3f(p));
		if (curvetype == "Bspline")
			curve = new BsplineCurve(controls);
		buildmesh();
	}